

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodes.c
# Opt level: O0

void rol_2A(void)

{
  ubyte uVar1;
  ubyte oldcar;
  
  uVar1 = carry_f;
  except = '\0';
  carry_f = acc & 0x80;
  acc = acc * '\x02';
  if (uVar1 != '\0') {
    acc = acc + '\x01';
  }
  result_f = acc;
  return;
}

Assistant:

void rol_2A(void) {
    ubyte oldcar;
    CLE;
    oldcar = carry_f;

    carry_f = acc & 0x80;
    acc <<= 1;
    if (oldcar) acc++;
    result_f = acc;
}